

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O2

int point_mul_g_id_tc26_gost_3410_2012_512_paramSetB
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,BN_CTX *ctx)

{
  uint64_t *puVar1;
  char cVar2;
  int iVar3;
  BIGNUM *pBVar4;
  BIGNUM *pBVar5;
  long lVar6;
  byte arg1;
  int iVar7;
  pt_aff_t_conflict3 (*papVar8) [16];
  pt_aff_t_conflict3 *arg3;
  uint uVar9;
  long lVar10;
  bool bVar11;
  uchar b_n [64];
  uchar b_x [64];
  uint64_t local_2d8 [16];
  uchar b_y [64];
  uint64_t local_218 [8];
  uint64_t local_1d8 [8];
  pt_aff_t_conflict3 local_198;
  uint64_t local_118 [8];
  uint64_t local_d8 [8];
  int8_t rnaf [103];
  
  BN_CTX_start((BN_CTX *)ctx);
  pBVar4 = BN_CTX_get((BN_CTX *)ctx);
  pBVar5 = BN_CTX_get((BN_CTX *)ctx);
  iVar7 = 0;
  if ((pBVar5 != (BIGNUM *)0x0) && (iVar3 = BN_bn2lebinpad(n,b_n,0x40), iVar3 == 0x40)) {
    rnaf[0x50] = '\0';
    rnaf[0x51] = '\0';
    rnaf[0x52] = '\0';
    rnaf[0x53] = '\0';
    rnaf[0x54] = '\0';
    rnaf[0x55] = '\0';
    rnaf[0x56] = '\0';
    rnaf[0x57] = '\0';
    rnaf[0x58] = '\0';
    rnaf[0x59] = '\0';
    rnaf[0x5a] = '\0';
    rnaf[0x5b] = '\0';
    rnaf[0x5c] = '\0';
    rnaf[0x5d] = '\0';
    rnaf[0x5e] = '\0';
    rnaf[0x40] = '\0';
    rnaf[0x41] = '\0';
    rnaf[0x42] = '\0';
    rnaf[0x43] = '\0';
    rnaf[0x44] = '\0';
    rnaf[0x45] = '\0';
    rnaf[0x46] = '\0';
    rnaf[0x47] = '\0';
    rnaf[0x48] = '\0';
    rnaf[0x49] = '\0';
    rnaf[0x4a] = '\0';
    rnaf[0x4b] = '\0';
    rnaf[0x4c] = '\0';
    rnaf[0x4d] = '\0';
    rnaf[0x4e] = '\0';
    rnaf[0x4f] = '\0';
    rnaf[0x30] = '\0';
    rnaf[0x31] = '\0';
    rnaf[0x32] = '\0';
    rnaf[0x33] = '\0';
    rnaf[0x34] = '\0';
    rnaf[0x35] = '\0';
    rnaf[0x36] = '\0';
    rnaf[0x37] = '\0';
    rnaf[0x38] = '\0';
    rnaf[0x39] = '\0';
    rnaf[0x3a] = '\0';
    rnaf[0x3b] = '\0';
    rnaf[0x3c] = '\0';
    rnaf[0x3d] = '\0';
    rnaf[0x3e] = '\0';
    rnaf[0x3f] = '\0';
    rnaf[0x20] = '\0';
    rnaf[0x21] = '\0';
    rnaf[0x22] = '\0';
    rnaf[0x23] = '\0';
    rnaf[0x24] = '\0';
    rnaf[0x25] = '\0';
    rnaf[0x26] = '\0';
    rnaf[0x27] = '\0';
    rnaf[0x28] = '\0';
    rnaf[0x29] = '\0';
    rnaf[0x2a] = '\0';
    rnaf[0x2b] = '\0';
    rnaf[0x2c] = '\0';
    rnaf[0x2d] = '\0';
    rnaf[0x2e] = '\0';
    rnaf[0x2f] = '\0';
    rnaf[0x10] = '\0';
    rnaf[0x11] = '\0';
    rnaf[0x12] = '\0';
    rnaf[0x13] = '\0';
    rnaf[0x14] = '\0';
    rnaf[0x15] = '\0';
    rnaf[0x16] = '\0';
    rnaf[0x17] = '\0';
    rnaf[0x18] = '\0';
    rnaf[0x19] = '\0';
    rnaf[0x1a] = '\0';
    rnaf[0x1b] = '\0';
    rnaf[0x1c] = '\0';
    rnaf[0x1d] = '\0';
    rnaf[0x1e] = '\0';
    rnaf[0x1f] = '\0';
    rnaf[0] = '\0';
    rnaf[1] = '\0';
    rnaf[2] = '\0';
    rnaf[3] = '\0';
    rnaf[4] = '\0';
    rnaf[5] = '\0';
    rnaf[6] = '\0';
    rnaf[7] = '\0';
    rnaf[8] = '\0';
    rnaf[9] = '\0';
    rnaf[10] = '\0';
    rnaf[0xb] = '\0';
    rnaf[0xc] = '\0';
    rnaf[0xd] = '\0';
    rnaf[0xe] = '\0';
    rnaf[0xf] = '\0';
    rnaf[0x5f] = '\0';
    rnaf[0x60] = '\0';
    rnaf[0x61] = '\0';
    rnaf[0x62] = '\0';
    rnaf[99] = '\0';
    rnaf[100] = '\0';
    rnaf[0x65] = '\0';
    rnaf[0x66] = '\0';
    memset(b_y,0,0xc0);
    puVar1 = local_198.Y;
    local_198.Y[6] = 0;
    local_198.Y[7] = 0;
    local_198.Y[4] = 0;
    local_198.Y[5] = 0;
    local_198.Y[2] = 0;
    local_198.Y[3] = 0;
    local_198.Y[0] = 0;
    local_198.Y[1] = 0;
    local_198.X[6] = 0;
    local_198.X[7] = 0;
    local_198.X[4] = 0;
    local_198.X[5] = 0;
    local_198.X[2] = 0;
    local_198.X[3] = 0;
    local_198.X[0] = 0;
    local_198.X[1] = 0;
    scalar_rwnaf(rnaf,b_n);
    b_x[0x30] = '\0';
    b_x[0x31] = '\0';
    b_x[0x32] = '\0';
    b_x[0x33] = '\0';
    b_x[0x34] = '\0';
    b_x[0x35] = '\0';
    b_x[0x36] = '\0';
    b_x[0x37] = '\0';
    b_x[0x38] = '\0';
    b_x[0x39] = '\0';
    b_x[0x3a] = '\0';
    b_x[0x3b] = '\0';
    b_x[0x3c] = '\0';
    b_x[0x3d] = '\0';
    b_x[0x3e] = '\0';
    b_x[0x3f] = '\0';
    b_x[0x20] = '\0';
    b_x[0x21] = '\0';
    b_x[0x22] = '\0';
    b_x[0x23] = '\0';
    b_x[0x24] = '\0';
    b_x[0x25] = '\0';
    b_x[0x26] = '\0';
    b_x[0x27] = '\0';
    b_x[0x28] = '\0';
    b_x[0x29] = '\0';
    b_x[0x2a] = '\0';
    b_x[0x2b] = '\0';
    b_x[0x2c] = '\0';
    b_x[0x2d] = '\0';
    b_x[0x2e] = '\0';
    b_x[0x2f] = '\0';
    b_x[0x10] = '\0';
    b_x[0x11] = '\0';
    b_x[0x12] = '\0';
    b_x[0x13] = '\0';
    b_x[0x14] = '\0';
    b_x[0x15] = '\0';
    b_x[0x16] = '\0';
    b_x[0x17] = '\0';
    b_x[0x18] = '\0';
    b_x[0x19] = '\0';
    b_x[0x1a] = '\0';
    b_x[0x1b] = '\0';
    b_x[0x1c] = '\0';
    b_x[0x1d] = '\0';
    b_x[0x1e] = '\0';
    b_x[0x1f] = '\0';
    b_x[0] = '\0';
    b_x[1] = '\0';
    b_x[2] = '\0';
    b_x[3] = '\0';
    b_x[4] = '\0';
    b_x[5] = '\0';
    b_x[6] = '\0';
    b_x[7] = '\0';
    b_x[8] = '\0';
    b_x[9] = '\0';
    b_x[10] = '\0';
    b_x[0xb] = '\0';
    b_x[0xc] = '\0';
    b_x[0xd] = '\0';
    b_x[0xe] = '\0';
    b_x[0xf] = '\0';
    local_2d8[0] = 0xffffffffffffff91;
    local_2d8[1] = 0xffffffffffffffff;
    local_2d8[2] = 0xffffffffffffffff;
    local_2d8[3] = 0xffffffffffffffff;
    local_2d8[4] = 0xffffffffffffffff;
    local_2d8[5] = 0xffffffffffffffff;
    local_2d8[6] = 0xffffffffffffffff;
    local_2d8[7] = 0x7fffffffffffffff;
    local_2d8[8] = 0;
    local_2d8[9] = 0;
    local_2d8[10] = 0;
    local_2d8[0xb] = 0;
    local_2d8[0xc] = 0;
    local_2d8[0xd] = 0;
    local_2d8[0xe] = 0;
    local_2d8[0xf] = 0;
    for (uVar9 = 7; -1 < (int)uVar9; uVar9 = uVar9 - 1) {
      if (uVar9 != 7) {
        iVar7 = 5;
        while (bVar11 = iVar7 != 0, iVar7 = iVar7 + -1, bVar11) {
          point_double((pt_prj_t_conflict3 *)b_x,(pt_prj_t_conflict3 *)b_x);
        }
      }
      papVar8 = lut_cmb;
      for (lVar6 = 0; lVar6 != 0xe; lVar6 = lVar6 + 1) {
        lVar10 = (ulong)uVar9 + lVar6 * 8;
        if ((int)lVar10 < 0x67) {
          cVar2 = rnaf[lVar10];
          lVar10 = 0;
          arg3 = *papVar8;
          for (; lVar10 != 0x10; lVar10 = lVar10 + 1) {
            bVar11 = (int)((int)(char)(-1 - (cVar2 >> 7)) + ((int)cVar2 >> 0x1f ^ (int)cVar2) >> 1 ^
                          (uint)lVar10) < 1;
            fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
                      (local_198.X,bVar11,local_198.X,arg3->X);
            fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz(puVar1,bVar11,puVar1,arg3->Y);
            arg3 = arg3 + 1;
          }
          fiat_id_tc26_gost_3410_2012_512_paramSetB_opp(local_d8,puVar1);
          fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
                    (puVar1,(byte)(cVar2 >> 7) >> 7,puVar1,local_d8);
          point_add_mixed((pt_prj_t_conflict3 *)b_x,(pt_prj_t_conflict3 *)b_x,&local_198);
        }
        papVar8 = (pt_aff_t_conflict3 (*) [16])((long)papVar8 + 0x800);
      }
    }
    local_198.X[6] = 0xffffffffffffffff;
    local_198.X[7] = 0x7fffffffffffffff;
    local_198.X[4] = 0xffffffffffffffff;
    local_198.X[5] = 0xffffffffffffffff;
    local_198.X[2] = 0xffffffffffffffff;
    local_198.X[3] = 0xffffffffffffffff;
    local_198.X[0] = 0xfffffffffffffeb3;
    local_198.X[1] = 0xffffffffffffffff;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_opp(puVar1,lut_cmb[0][0].Y);
    point_add_mixed((pt_prj_t_conflict3 *)b_y,(pt_prj_t_conflict3 *)b_x,&local_198);
    arg1 = b_n[0] & 1;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
              ((uint64_t *)b_x,arg1,(uint64_t *)b_y,(uint64_t *)b_x);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz(local_2d8,arg1,local_218,local_2d8);
    puVar1 = local_2d8 + 8;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz(puVar1,arg1,local_1d8,puVar1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_inv(puVar1,puVar1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(local_118,(uint64_t *)b_x,puVar1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(local_d8,local_2d8,puVar1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(local_118,local_118);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(local_d8,local_d8);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(b_x,local_118);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(b_y,local_d8);
    iVar7 = CRYPTO_memcmp("",b_x,0x40);
    if ((iVar7 == 0) && (iVar7 = CRYPTO_memcmp("",b_y,0x40), iVar7 == 0)) {
      iVar7 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar7 == 0) {
        iVar7 = 0;
        goto LAB_00135ecd;
      }
    }
    else {
      lVar6 = BN_lebin2bn(b_x,0x40,pBVar4);
      iVar7 = 0;
      if ((lVar6 == 0) ||
         ((lVar6 = BN_lebin2bn(b_y,0x40,pBVar5), lVar6 == 0 ||
          (iVar3 = EC_POINT_set_affine_coordinates(group,r,pBVar4,pBVar5,ctx), iVar3 == 0))))
      goto LAB_00135ecd;
    }
    iVar7 = 1;
  }
LAB_00135ecd:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar7;
}

Assistant:

int
    point_mul_g_id_tc26_gost_3410_2012_512_paramSetB(const EC_GROUP *group,
                                                     EC_POINT *r,
                                                     const BIGNUM *n,
                                                     BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_n[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL || BN_bn2lebinpad(n, b_n, 64) != 64)
        goto err;
    /* do the fixed scalar multiplication */
    point_mul_g(b_x, b_y, b_n);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}